

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int ParseEXRHeaderFromMemory(EXRHeader *exr_header,EXRVersion *version,uchar *memory,char **err)

{
  int iVar1;
  char *pcVar2;
  string err_str;
  HeaderInfo info;
  string local_d8;
  HeaderInfo local_b8;
  
  if (exr_header == (EXRHeader *)0x0 || memory == (uchar *)0x0) {
    iVar1 = -3;
    if (err != (char **)0x0) {
      *err = "Invalid argument.\n";
    }
  }
  else {
    local_b8.attributes.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.attributes.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.channels.
    super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.channels.
    super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.channels.
    super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.attributes.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.tile_level_mode = 0;
    local_b8.tile_rounding_mode = 0;
    local_b8.header_len = 0;
    local_b8.compression_type = 0;
    local_b8.pixel_aspect_ratio = 0.0;
    local_b8.chunk_count = 0;
    local_b8.tile_size_x = 0;
    local_b8.tile_size_y = 0;
    local_b8.display_window[3] = 0;
    local_b8.screen_window_center[0] = 0.0;
    local_b8.screen_window_center[1] = 0.0;
    local_b8.screen_window_width = 0.0;
    local_b8.line_order = 0;
    local_b8.display_window[0] = 0;
    local_b8.display_window[1] = 0;
    local_b8.display_window[2] = 0;
    local_b8.data_window[0] = 0;
    local_b8.data_window[1] = 0;
    local_b8.data_window[2] = 0;
    local_b8.data_window[3] = 0;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    iVar1 = tinyexr::ParseEXRHeader(&local_b8,(bool *)0x0,version,&local_d8,memory + 8);
    if (((err != (char **)0x0) && (iVar1 != 0)) && (local_d8._M_string_length != 0)) {
      pcVar2 = strdup(local_d8._M_dataplus._M_p);
      *err = pcVar2;
    }
    tinyexr::ConvertHeader(exr_header,&local_b8);
    exr_header->tiled = version->tiled;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                               local_d8.field_2._M_local_buf[0]) + 1);
    }
    if (local_b8.attributes.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.attributes.
                      super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.attributes.
                            super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.attributes.
                            super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::~vector
              (&local_b8.channels);
  }
  return iVar1;
}

Assistant:

int ParseEXRHeaderFromMemory(EXRHeader *exr_header, const EXRVersion *version,
                             const unsigned char *memory, const char **err) {
  if (memory == NULL || exr_header == NULL) {
    if (err) {
      (*err) = "Invalid argument.\n";
    }

    // Invalid argument
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  const char *buf = reinterpret_cast<const char *>(memory);

  const char *marker = &buf[4 + 4];  // skip magic number + version header

  tinyexr::HeaderInfo info;
  info.clear();

  std::string err_str;
  int ret = ParseEXRHeader(&info, NULL, version, &err_str,
                           reinterpret_cast<const unsigned char *>(marker));

  if (ret != TINYEXR_SUCCESS) {
    if (err && !err_str.empty()) {
      (*err) = strdup(err_str.c_str());  // May leak
    }
  }

  ConvertHeader(exr_header, info);

  // transfoer `tiled` from version.
  exr_header->tiled = version->tiled;

  return ret;
}